

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

SerialArenaChunk *
google::protobuf::internal::ThreadSafeArena::NewSerialArenaChunk
          (uint32_t prev_capacity,void *id,SerialArena *serial)

{
  uint uVar1;
  ulong uVar2;
  Nullable<const_char_*> failure_msg;
  SizedPtr SVar3;
  LogMessageFatal local_38;
  size_t local_28;
  
  uVar2 = ((ulong)prev_capacity * 0x10 + 0x10) * 4;
  if (0xfff < uVar2) {
    uVar2 = 0x1000;
  }
  uVar1 = (int)uVar2 - 0x10U >> 4;
  SVar3 = AllocateAtLeast((ulong)(uVar1 * 8 + 0x10) + (ulong)(uVar1 * 8));
  local_28 = SVar3.n;
  uVar1 = (int)SVar3.n - 0x10U >> 4;
  local_38.super_LogMessage._0_8_ = (ulong)(uVar1 * 8 + 0x10) + (ulong)(uVar1 * 8);
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                          ((unsigned_long *)&local_38,&local_28,
                           "SerialArenaChunk::AllocSize(next_capacity) <= mem.n");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    SerialArenaChunk::SerialArenaChunk((SerialArenaChunk *)SVar3.p,uVar1,id,serial);
    return (SerialArenaChunk *)SVar3.p;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0x2b1,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
}

Assistant:

ThreadSafeArena::SerialArenaChunk* ThreadSafeArena::NewSerialArenaChunk(
    uint32_t prev_capacity, void* id, SerialArena* serial) {
  constexpr size_t kMaxBytes = 4096;  // Can hold up to 255 entries.
  constexpr size_t kGrowthFactor = 4;
  constexpr size_t kHeaderSize = SerialArenaChunk::AllocSize(0);
  constexpr size_t kEntrySize = SerialArenaChunk::AllocSize(1) - kHeaderSize;

  // On x64 arch: {4, 16, 64, 256, 256, ...} * 16.
  size_t prev_bytes = SerialArenaChunk::AllocSize(prev_capacity);
  size_t next_bytes = std::min(kMaxBytes, prev_bytes * kGrowthFactor);
  uint32_t next_capacity =
      static_cast<uint32_t>(next_bytes - kHeaderSize) / kEntrySize;
  // Growth based on bytes needs to be adjusted by AllocSize.
  next_bytes = SerialArenaChunk::AllocSize(next_capacity);

  // If we allocate bigger memory than requested, we should expand
  // size to use that extra space, and add extra entries permitted
  // by the extra space.
  SizedPtr mem = AllocateAtLeast(next_bytes);
  next_capacity = static_cast<uint32_t>(mem.n - kHeaderSize) / kEntrySize;
  ABSL_DCHECK_LE(SerialArenaChunk::AllocSize(next_capacity), mem.n);
  return new (mem.p) SerialArenaChunk{next_capacity, id, serial};
}